

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O0

void __thiscall ThreadWrapper::ThreadWrapper(ThreadWrapper *this)

{
  atomic<int> aVar1;
  ulong uVar2;
  __atomic_base<int> _Var3;
  __atomic_base<int> _Var4;
  __atomic_base<int> _Var5;
  pthread_t pVar6;
  long lVar7;
  SimpleLoggerMgr *pSVar8;
  pthread_t *in_RDI;
  bool bVar9;
  SimpleLoggerMgr *mgr;
  size_t count;
  size_t MAX_NUM_CMP;
  int exp;
  uint32_t tid;
  int num_digits;
  __atomic_base<int> in_stack_fffffffffffffed4;
  undefined4 in_stack_fffffffffffffed8;
  __atomic_base<int> in_stack_fffffffffffffedc;
  undefined4 in_stack_ffffffffffffff08;
  __atomic_base<int> in_stack_ffffffffffffff0c;
  undefined4 in_stack_ffffffffffffff10;
  __atomic_base<int> in_stack_ffffffffffffff14;
  ulong local_68;
  __atomic_base<int> local_54;
  uint local_50;
  __atomic_base<int> local_4c;
  undefined4 local_40;
  __int_type_conflict local_3c;
  __atomic_base<int> *local_38;
  atomic<int> *local_30;
  bool local_21;
  __int_type_conflict local_20;
  memory_order local_1c;
  undefined4 local_18;
  __int_type_conflict local_14;
  __atomic_base<int> *local_10;
  atomic<int> *local_8;
  
  pVar6 = pthread_self();
  *in_RDI = pVar6;
  lVar7 = syscall(0xba);
  *(int *)(in_RDI + 1) = (int)lVar7;
  local_4c._M_i = 0;
  for (local_50 = (uint)in_RDI[1]; local_50 != 0; local_50 = local_50 / 10) {
    local_4c._M_i = local_4c._M_i + 1;
  }
  local_54._M_i =
       std::__atomic_base::operator_cast_to_int
                 ((__atomic_base<int> *)
                  CONCAT44(in_stack_fffffffffffffedc._M_i,in_stack_fffffffffffffed8));
  local_68 = 0;
  while( true ) {
    _Var4._M_i = local_4c._M_i;
    uVar2 = local_68;
    if (local_54._M_i < local_4c._M_i) {
      local_68 = local_68 + 1;
    }
    if (local_54._M_i >= local_4c._M_i || 9 < uVar2) break;
    local_30 = &tid_digits;
    local_3c = local_4c._M_i;
    local_40 = 5;
    local_38 = &local_54;
    local_1c = std::__cmpexch_failure_order(in_stack_fffffffffffffed4._M_i);
    _Var3._M_i = local_54._M_i;
    aVar1 = tid_digits;
    local_8 = &tid_digits;
    local_14 = _Var4._M_i;
    local_18 = 5;
    local_20 = _Var4._M_i;
    switch(0x1c97ca) {
    default:
      if (local_1c - memory_order_consume < 2) {
        LOCK();
        bVar9 = (__atomic_base<int>)local_54._M_i == tid_digits.super___atomic_base<int>._M_i;
        _Var5 = tid_digits.super___atomic_base<int>._M_i;
        if (bVar9) {
          tid_digits.super___atomic_base<int>._M_i =
               (__atomic_base<int>)(__atomic_base<int>)_Var4._M_i;
          _Var5._M_i = local_54._M_i;
        }
        UNLOCK();
        if (!bVar9) {
          local_54._M_i = _Var5._M_i;
        }
      }
      else if (local_1c == memory_order_seq_cst) {
        LOCK();
        bVar9 = (__atomic_base<int>)local_54._M_i == tid_digits.super___atomic_base<int>._M_i;
        _Var5 = tid_digits.super___atomic_base<int>._M_i;
        if (bVar9) {
          tid_digits.super___atomic_base<int>._M_i =
               (__atomic_base<int>)(__atomic_base<int>)_Var4._M_i;
          _Var5._M_i = local_54._M_i;
        }
        UNLOCK();
        if (!bVar9) {
          local_54._M_i = _Var5._M_i;
        }
      }
      else {
        LOCK();
        bVar9 = (__atomic_base<int>)local_54._M_i == tid_digits.super___atomic_base<int>._M_i;
        _Var5 = tid_digits.super___atomic_base<int>._M_i;
        if (bVar9) {
          tid_digits.super___atomic_base<int>._M_i =
               (__atomic_base<int>)(__atomic_base<int>)_Var4._M_i;
          _Var5._M_i = local_54._M_i;
        }
        UNLOCK();
        if (!bVar9) {
          local_54._M_i = _Var5._M_i;
        }
      }
      break;
    case 2:
      if (local_1c - memory_order_consume < 2) {
        LOCK();
        bVar9 = (__atomic_base<int>)local_54._M_i == tid_digits.super___atomic_base<int>._M_i;
        in_stack_ffffffffffffff0c = tid_digits.super___atomic_base<int>._M_i;
        if (bVar9) {
          tid_digits.super___atomic_base<int>._M_i =
               (__atomic_base<int>)(__atomic_base<int>)_Var4._M_i;
          in_stack_ffffffffffffff0c._M_i = local_54._M_i;
        }
        UNLOCK();
        in_stack_ffffffffffffff08 = CONCAT13(bVar9,(int3)in_stack_ffffffffffffff08);
        if (!bVar9) {
          local_54._M_i = in_stack_ffffffffffffff0c._M_i;
        }
      }
      else if (local_1c == memory_order_seq_cst) {
        LOCK();
        bVar9 = (__atomic_base<int>)local_54._M_i == tid_digits.super___atomic_base<int>._M_i;
        _Var5 = tid_digits.super___atomic_base<int>._M_i;
        if (bVar9) {
          tid_digits.super___atomic_base<int>._M_i =
               (__atomic_base<int>)(__atomic_base<int>)_Var4._M_i;
          _Var5._M_i = local_54._M_i;
        }
        UNLOCK();
        if (!bVar9) {
          local_54._M_i = _Var5._M_i;
        }
      }
      else {
        LOCK();
        bVar9 = (__atomic_base<int>)local_54._M_i == tid_digits.super___atomic_base<int>._M_i;
        in_stack_ffffffffffffff14 = tid_digits.super___atomic_base<int>._M_i;
        if (bVar9) {
          tid_digits.super___atomic_base<int>._M_i =
               (__atomic_base<int>)(__atomic_base<int>)_Var4._M_i;
          in_stack_ffffffffffffff14._M_i = local_54._M_i;
        }
        UNLOCK();
        in_stack_ffffffffffffff10 = CONCAT13(bVar9,(int3)in_stack_ffffffffffffff10);
        if (!bVar9) {
          local_54._M_i = in_stack_ffffffffffffff14._M_i;
        }
      }
      break;
    case 3:
      if (local_1c - memory_order_consume < 2) {
        LOCK();
        bVar9 = (__atomic_base<int>)local_54._M_i == tid_digits.super___atomic_base<int>._M_i;
        _Var5 = tid_digits.super___atomic_base<int>._M_i;
        if (bVar9) {
          tid_digits.super___atomic_base<int>._M_i =
               (__atomic_base<int>)(__atomic_base<int>)_Var4._M_i;
          _Var5._M_i = local_54._M_i;
        }
        UNLOCK();
        if (!bVar9) {
          local_54._M_i = _Var5._M_i;
        }
      }
      else if (local_1c == memory_order_seq_cst) {
        LOCK();
        bVar9 = (__atomic_base<int>)local_54._M_i == tid_digits.super___atomic_base<int>._M_i;
        _Var5 = tid_digits.super___atomic_base<int>._M_i;
        if (bVar9) {
          tid_digits.super___atomic_base<int>._M_i =
               (__atomic_base<int>)(__atomic_base<int>)_Var4._M_i;
          _Var5._M_i = local_54._M_i;
        }
        UNLOCK();
        if (!bVar9) {
          local_54._M_i = _Var5._M_i;
        }
      }
      else {
        LOCK();
        bVar9 = (__atomic_base<int>)local_54._M_i == tid_digits.super___atomic_base<int>._M_i;
        _Var5 = tid_digits.super___atomic_base<int>._M_i;
        if (bVar9) {
          tid_digits.super___atomic_base<int>._M_i =
               (__atomic_base<int>)(__atomic_base<int>)_Var4._M_i;
          _Var5._M_i = local_54._M_i;
        }
        UNLOCK();
        if (!bVar9) {
          local_54._M_i = _Var5._M_i;
        }
      }
      break;
    case 4:
      if (local_1c - memory_order_consume < 2) {
        LOCK();
        bVar9 = (__atomic_base<int>)local_54._M_i == tid_digits.super___atomic_base<int>._M_i;
        in_stack_fffffffffffffedc = tid_digits.super___atomic_base<int>._M_i;
        if (bVar9) {
          tid_digits.super___atomic_base<int>._M_i =
               (__atomic_base<int>)(__atomic_base<int>)_Var4._M_i;
          in_stack_fffffffffffffedc._M_i = local_54._M_i;
        }
        UNLOCK();
        in_stack_fffffffffffffed8 = CONCAT13(bVar9,(int3)in_stack_fffffffffffffed8);
        if (!bVar9) {
          local_54._M_i = in_stack_fffffffffffffedc._M_i;
        }
      }
      else if (local_1c == memory_order_seq_cst) {
        LOCK();
        bVar9 = (__atomic_base<int>)local_54._M_i == tid_digits.super___atomic_base<int>._M_i;
        in_stack_fffffffffffffed4 = tid_digits.super___atomic_base<int>._M_i;
        if (bVar9) {
          tid_digits.super___atomic_base<int>._M_i =
               (__atomic_base<int>)(__atomic_base<int>)_Var4._M_i;
          in_stack_fffffffffffffed4._M_i = local_54._M_i;
        }
        UNLOCK();
        if (!bVar9) {
          local_54._M_i = in_stack_fffffffffffffed4._M_i;
        }
      }
      else {
        LOCK();
        bVar9 = (__atomic_base<int>)local_54._M_i == tid_digits.super___atomic_base<int>._M_i;
        _Var5 = tid_digits.super___atomic_base<int>._M_i;
        if (bVar9) {
          tid_digits.super___atomic_base<int>._M_i =
               (__atomic_base<int>)(__atomic_base<int>)_Var4._M_i;
          _Var5._M_i = local_54._M_i;
        }
        UNLOCK();
        if (!bVar9) {
          local_54._M_i = _Var5._M_i;
        }
      }
    }
    local_21 = (__atomic_base<int>)_Var3._M_i == aVar1.super___atomic_base<int>._M_i;
    local_10 = &local_54;
    if (local_21) break;
    local_54._M_i =
         std::__atomic_base::operator_cast_to_int
                   ((__atomic_base<int> *)
                    CONCAT44(in_stack_fffffffffffffedc._M_i,in_stack_fffffffffffffed8));
  }
  pSVar8 = SimpleLoggerMgr::getWithoutInit();
  if (pSVar8 != (SimpleLoggerMgr *)0x0) {
    SimpleLoggerMgr::addThread
              ((SimpleLoggerMgr *)CONCAT44(in_stack_ffffffffffffff14._M_i,in_stack_ffffffffffffff10)
               ,CONCAT44(in_stack_ffffffffffffff0c._M_i,in_stack_ffffffffffffff08));
  }
  return;
}

Assistant:

ThreadWrapper() {
        mySelf = (uint64_t)pthread_self();
        myTid = (uint32_t)syscall(SYS_gettid);

        // Get the number of digits for alignment.
        int num_digits = 0;
        uint32_t tid = myTid;
        while (tid) {
            num_digits++;
            tid /= 10;
        }
        int exp = tid_digits;
        const size_t MAX_NUM_CMP = 10;
        size_t count = 0;
        while (exp < num_digits && count++ < MAX_NUM_CMP) {
            if (tid_digits.compare_exchange_strong(exp, num_digits)) {
                break;
            }
            exp = tid_digits;
        }

        SimpleLoggerMgr* mgr = SimpleLoggerMgr::getWithoutInit();
        if (mgr) {
            mgr->addThread(mySelf);
        }
    }